

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentProperty(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,string *lhs,string *rhs,CompatibleType t)

{
  __type _Var1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  char *rhs_00;
  pair<bool,_const_char_*> pVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  bool local_9a;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  bool local_78 [8];
  pair<bool,_const_char_*> value;
  bool same;
  bool local_49;
  undefined1 local_48 [8];
  string null_ptr;
  CompatibleType t_local;
  string *rhs_local;
  string *lhs_local;
  
  null_ptr.field_2._12_4_ = t;
  valueAsString<decltype(nullptr)>((string *)local_48,(nullptr_t)0x0);
  _Var1 = std::operator==(lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48);
  if ((_Var1) &&
     (_Var1 = std::operator==(rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48), _Var1)) {
    local_49 = true;
    std::make_pair<bool,std::__cxx11::string_const&>(__return_storage_ptr__,&local_49,lhs);
  }
  else {
    _Var1 = std::operator==(lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48);
    if (_Var1) {
      value.second._7_1_ = 1;
      std::make_pair<bool,std::__cxx11::string_const&>
                (__return_storage_ptr__,(bool *)((long)&value.second + 7),rhs);
    }
    else {
      _Var1 = std::operator==(rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48);
      if (_Var1) {
        value.second._6_1_ = 1;
        std::make_pair<bool,std::__cxx11::string_const&>
                  (__return_storage_ptr__,(bool *)((long)&value.second + 6),lhs);
      }
      else if (null_ptr.field_2._12_4_ == 0) {
        bVar2 = cmSystemTools::IsOn(lhs);
        bVar3 = cmSystemTools::IsOn(rhs);
        value.second._5_1_ = bVar2 == bVar3;
        local_c8 = lhs;
        if (!(bool)value.second._5_1_) {
          local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
        }
        std::make_pair<bool&,std::__cxx11::string_const&>
                  (__return_storage_ptr__,(bool *)((long)&value.second + 5),local_c8);
      }
      else if (null_ptr.field_2._12_4_ == 1) {
        consistentStringProperty(__return_storage_ptr__,lhs,rhs);
      }
      else {
        if (1 < null_ptr.field_2._12_4_ - 2) {
          __assert_fail("false && \"Unreachable!\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                        ,0x11dc,
                        "std::pair<bool, std::string> consistentProperty(const std::string &, const std::string &, CompatibleType)"
                       );
        }
        pcVar4 = (char *)std::__cxx11::string::c_str();
        rhs_00 = (char *)std::__cxx11::string::c_str();
        pVar5 = consistentNumberProperty(pcVar4,rhs_00,null_ptr.field_2._12_4_);
        pcVar4 = pVar5.second;
        local_78[0] = pVar5.first;
        local_9a = ((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
        value._0_8_ = pcVar4;
        if (local_9a) {
          std::__cxx11::string::string((string *)&local_98,(string *)local_48);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar4,&local_99);
        }
        local_9a = !local_9a;
        std::make_pair<bool&,std::__cxx11::string_const>(__return_storage_ptr__,local_78,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        if (local_9a) {
          std::allocator<char>::~allocator(&local_99);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> consistentProperty(const std::string& lhs,
                                                const std::string& rhs,
                                                CompatibleType t)
{
  const std::string null_ptr = valueAsString(nullptr);

  if (lhs == null_ptr && rhs == null_ptr) {
    return std::make_pair(true, lhs);
  }
  if (lhs == null_ptr) {
    return std::make_pair(true, rhs);
  }
  if (rhs == null_ptr) {
    return std::make_pair(true, lhs);
  }

  switch (t) {
    case BoolType: {
      bool same = cmSystemTools::IsOn(lhs) == cmSystemTools::IsOn(rhs);
      return std::make_pair(same, same ? lhs : null_ptr);
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType: {
      auto value = consistentNumberProperty(lhs.c_str(), rhs.c_str(), t);
      return std::make_pair(
        value.first, value.first ? std::string(value.second) : null_ptr);
    }
  }
  assert(false && "Unreachable!");
  return std::pair<bool, std::string>(false, null_ptr);
}